

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O2

MPP_RET mpp_slots_get_prop(MppBufSlots slots,SlotsPropType type,void *val)

{
  ulong uVar1;
  undefined4 uVar2;
  MPP_RET MVar3;
  MppFrame frame;
  AutoMutex auto_lock;
  
  uVar1 = (ulong)type;
  if (((0xb < (int)type) || (slots == (MppBufSlots)0x0)) || (val == (void *)0x0)) {
    _mpp_log_l(2,"mpp_buf_slot","found invalid input slots %p type %d val %p\n","mpp_slots_get_prop"
               ,slots,uVar1,val);
    return MPP_NOK;
  }
  auto_lock.mLock = *slots;
  auto_lock.mEnabled = 1;
  if ((pthread_mutex_t *)auto_lock.mLock != (pthread_mutex_t *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)auto_lock.mLock);
  }
  switch(uVar1) {
  case 0:
    uVar2 = *(undefined4 *)((long)slots + 0x24);
    break;
  default:
    _mpp_log_l(2,"mpp_buf_slot","can not get slots prop type %d\n",(char *)0x0,uVar1);
    MVar3 = MPP_NOK;
    goto LAB_0012f970;
  case 6:
    uVar2 = *(undefined4 *)((long)slots + 0x60);
    break;
  case 7:
    uVar2 = *(undefined4 *)((long)slots + 0x58);
    break;
  case 8:
    mpp_frame_copy(val,*(MppFrame *)((long)slots + 0x90));
    goto LAB_0012f96e;
  }
  *(undefined4 *)val = uVar2;
LAB_0012f96e:
  MVar3 = MPP_OK;
LAB_0012f970:
  Mutex::Autolock::~Autolock(&auto_lock);
  return MVar3;
}

Assistant:

MPP_RET mpp_slots_get_prop(MppBufSlots slots, SlotsPropType type, void *val)
{
    if (NULL == slots || NULL == val || type >= SLOTS_PROP_BUTT) {
        mpp_err_f("found invalid input slots %p type %d val %p\n", slots, type, val);
        return MPP_NOK;
    }

    MppBufSlotsImpl *impl = (MppBufSlotsImpl *)slots;
    AutoMutex auto_lock(impl->lock);
    MPP_RET ret = MPP_OK;

    switch (type) {
    case SLOTS_EOS: {
        *((RK_U32 *)val) = impl->eos;
    } break;
    case SLOTS_COUNT: {
        *((RK_U32 *)val) = impl->buf_count;
    } break;
    case SLOTS_SIZE: {
        *((RK_U32 *)val) = (RK_U32)impl->buf_size;
    } break;
    case SLOTS_FRAME_INFO: {
        MppFrame frame = (MppFrame)val;
        MppFrame info  = impl->info;
        mpp_frame_copy(frame, info);
    } break;
    default : {
        mpp_err("can not get slots prop type %d\n", type);
        ret = MPP_NOK;
    } break;
    }

    return ret;
}